

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.cc
# Opt level: O0

int absl::lts_20250127::SharedCompareImpl<absl::lts_20250127::Cord>(Cord *lhs,Cord *rhs)

{
  size_t size_to_compare;
  size_t size_to_compare_00;
  int local_40;
  int local_3c;
  int data_comp_res;
  int data_comp_res_1;
  size_t rhs_size;
  size_t lhs_size;
  Cord *rhs_local;
  Cord *lhs_local;
  
  size_to_compare = Cord::size(lhs);
  size_to_compare_00 = Cord::size(rhs);
  if (size_to_compare == size_to_compare_00) {
    lhs_local._4_4_ = GenericCompare<int,absl::lts_20250127::Cord>(lhs,rhs,size_to_compare);
  }
  else if (size_to_compare < size_to_compare_00) {
    local_3c = GenericCompare<int,absl::lts_20250127::Cord>(lhs,rhs,size_to_compare);
    if (local_3c == 0) {
      local_3c = -1;
    }
    lhs_local._4_4_ = local_3c;
  }
  else {
    local_40 = GenericCompare<int,absl::lts_20250127::Cord>(lhs,rhs,size_to_compare_00);
    if (local_40 == 0) {
      local_40 = 1;
    }
    lhs_local._4_4_ = local_40;
  }
  return lhs_local._4_4_;
}

Assistant:

inline int SharedCompareImpl(const Cord& lhs, const RHS& rhs) {
  size_t lhs_size = lhs.size();
  size_t rhs_size = rhs.size();
  if (lhs_size == rhs_size) {
    return GenericCompare<int>(lhs, rhs, lhs_size);
  }
  if (lhs_size < rhs_size) {
    auto data_comp_res = GenericCompare<int>(lhs, rhs, lhs_size);
    return data_comp_res == 0 ? -1 : data_comp_res;
  }

  auto data_comp_res = GenericCompare<int>(lhs, rhs, rhs_size);
  return data_comp_res == 0 ? +1 : data_comp_res;
}